

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::TrackArgumentsSym(GlobOptBlockData *this,RegOpnd *opnd)

{
  uint uVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JitArenaAllocator *pJVar3;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  JITTimeFunctionBody *pJVar4;
  char16 *pcVar5;
  char16 *pcVar6;
  char16 *pcVar7;
  char16 *pcVar8;
  wchar local_108 [4];
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  TrackAllocData local_40;
  RegOpnd *local_18;
  RegOpnd *opnd_local;
  GlobOptBlockData *this_local;
  
  local_18 = opnd;
  opnd_local = (RegOpnd *)this;
  if (this->curFunc->argObjSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pJVar3 = this->globOpt->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
               ,0x4ba);
    pJVar3 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar3,&local_40);
    stack0xffffffffffffffb0 = Memory::JitArenaAllocator::Alloc;
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,pJVar3,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,this->globOpt->alloc);
    this->curFunc->argObjSyms = this_00;
  }
  BVSparse<Memory::JitArenaAllocator>::Set
            (this->curFunc->argObjSyms,(local_18->m_sym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Set(this->argObjSyms,(local_18->m_sym->super_Sym).m_id);
  sourceContextId = Func::GetSourceContextId(this->globOpt->func);
  functionId = Func::GetLocalFunctionId(this->globOpt->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackArgOptPhase,sourceContextId,functionId)
  ;
  if (bVar2) {
    uVar1 = (local_18->m_sym->super_Sym).m_id;
    pJVar4 = Func::GetJITFunctionBody(this->curFunc);
    pcVar5 = JITTimeFunctionBody::GetDisplayName(pJVar4);
    pcVar6 = Func::GetDebugNumberSet(this->curFunc,(wchar (*) [42])local_a8);
    pJVar4 = Func::GetJITFunctionBody(this->globOpt->func);
    pcVar7 = JITTimeFunctionBody::GetDisplayName(pJVar4);
    pcVar8 = Func::GetDebugNumberSet(this->globOpt->func,(wchar (*) [42])local_108);
    Output::Print(L"Created a new alias s%d for arguments object in function %s(%s) topFunc %s(%s)\n"
                  ,(ulong)uVar1,pcVar5,pcVar6,pcVar7,pcVar8);
    Output::Flush();
  }
  return;
}

Assistant:

void
GlobOptBlockData::TrackArgumentsSym(IR::RegOpnd const* opnd)
{
    if(!this->curFunc->argObjSyms)
    {
        this->curFunc->argObjSyms = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
    }
    this->curFunc->argObjSyms->Set(opnd->m_sym->m_id);
    this->argObjSyms->Set(opnd->m_sym->m_id);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TESTTRACE(Js::StackArgOptPhase, this->globOpt->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Created a new alias s%d for arguments object in function %s(%s) topFunc %s(%s)\n"),
            opnd->m_sym->m_id,
            this->curFunc->GetJITFunctionBody()->GetDisplayName(),
            this->curFunc->GetDebugNumberSet(debugStringBuffer),
            this->globOpt->func->GetJITFunctionBody()->GetDisplayName(),
            this->globOpt->func->GetDebugNumberSet(debugStringBuffer2)
            );
        Output::Flush();
    }
#endif
}